

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SamProgram.h
# Opt level: O0

SamProgram * __thiscall BamTools::SamProgram::operator=(SamProgram *this,SamProgram *param_2)

{
  string *in_RSI;
  string *in_RDI;
  vector<BamTools::CustomHeaderTag,_std::allocator<BamTools::CustomHeaderTag>_> *in_stack_00000088;
  vector<BamTools::CustomHeaderTag,_std::allocator<BamTools::CustomHeaderTag>_> *in_stack_00000090;
  
  std::__cxx11::string::operator=(in_RDI,in_RSI);
  std::__cxx11::string::operator=(in_RDI + 0x20,in_RSI + 0x20);
  std::__cxx11::string::operator=(in_RDI + 0x40,in_RSI + 0x40);
  std::__cxx11::string::operator=(in_RDI + 0x60,in_RSI + 0x60);
  std::__cxx11::string::operator=(in_RDI + 0x80,in_RSI + 0x80);
  std::vector<BamTools::CustomHeaderTag,_std::allocator<BamTools::CustomHeaderTag>_>::operator=
            (in_stack_00000090,in_stack_00000088);
  std::__cxx11::string::operator=(in_RDI + 0xb8,in_RSI + 0xb8);
  return (SamProgram *)in_RDI;
}

Assistant:

struct API_EXPORT SamProgram {

    // ctor & dtor
    SamProgram(void);
    SamProgram(const std::string& id);
    SamProgram(const SamProgram& other);
    ~SamProgram(void);

    // query/modify entire program record
    void Clear(void);                      // clears all data fields

    // convenience query methods
    bool HasCommandLine(void) const;       // returns true if program record has a command line entry
    bool HasID(void) const;                // returns true if program record has an ID
    bool HasName(void) const;              // returns true if program record has a name
    bool HasPreviousProgramID(void) const; // returns true if program record has a 'previous program ID'
    bool HasVersion(void) const;           // returns true if program record has a version

    // data members
    std::string CommandLine;               // CL:<CommandLine>
    std::string ID;                        // ID:<ID>          *Required for valid SAM header*
    std::string Name;                      // PN:<Name>
    std::string PreviousProgramID;         // PP:<PreviousProgramID>
    std::string Version;                   // VN:<Version>
    std::vector<CustomHeaderTag> CustomTags;   // optional custom tags

    // internal (non-standard) methods & fields
    private:
        bool HasNextProgramID(void) const;
        std::string NextProgramID;
        friend class BamTools::SamProgramChain;
}